

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O1

int mg_is_error(int n)

{
  int iVar1;
  int *piVar2;
  int iVar3;
  int iVar4;
  
  iVar4 = 1;
  if (n != 0) {
    iVar3 = 0;
    iVar4 = 0;
    if (n < 0) {
      piVar2 = __errno_location();
      iVar1 = *piVar2;
      iVar4 = iVar3;
      if (((iVar1 != 4) && (iVar1 != 0xb)) && (iVar1 != 0x73)) {
        iVar4 = 1;
      }
    }
  }
  return iVar4;
}

Assistant:

int mg_is_error(int n) {
#ifdef MG_CC3200
                                                                                                                            DBG(("n = %d, errno = %d", n, errno));
  if (n < 0) errno = n;
#endif
    return n == 0 || (n < 0 && errno != EINTR && errno != EINPROGRESS &&
                      errno != EAGAIN && errno != EWOULDBLOCK
#ifdef MG_CC3200
            && errno != SL_EALREADY
#endif
#ifdef _WIN32
                                                                                                                            && WSAGetLastError() != WSAEINTR &&
                    WSAGetLastError() != WSAEWOULDBLOCK
#endif
    );
}